

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterConversion.h
# Opt level: O0

void PixelToaster::convert_XBGRFFFF_to_XRGB1555(Pixel *source,integer16 *destination,uint count)

{
  integer32 iVar1;
  integer32 iVar2;
  integer32 iVar3;
  integer32 b;
  integer32 g;
  integer32 r;
  uint i;
  uint count_local;
  integer16 *destination_local;
  Pixel *source_local;
  
  for (g = 0; g < count; g = g + 1) {
    iVar1 = clamped_fraction_5(source[g].r);
    iVar2 = clamped_fraction_5(source[g].g);
    iVar3 = clamped_fraction_5(source[g].b);
    destination[g] = (ushort)(iVar1 >> 8) | (ushort)(iVar2 >> 0xd) | (ushort)(iVar3 >> 0x12);
  }
  return;
}

Assistant:

inline void convert_XBGRFFFF_to_XRGB1555(const Pixel source[], integer16 destination[], unsigned int count)
{
    for (unsigned int i = 0; i < count; ++i)
    {
        const integer32 r = clamped_fraction_5(source[i].r) >> 8;
        const integer32 g = clamped_fraction_5(source[i].g) >> 13;
        const integer32 b = clamped_fraction_5(source[i].b) >> 18;

        destination[i] = (integer16)(r | g | b);
    }
}